

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

string * __thiscall
CLI::detail::join<std::set<int,std::less<int>,std::allocator<int>>>
          (string *__return_storage_ptr__,detail *this,
          set<int,_std::less<int>,_std::allocator<int>_> *v,string *delim)

{
  bool bVar1;
  reference piVar2;
  int *i;
  iterator __end0;
  iterator __begin0;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  size_t start;
  ostringstream s;
  string *delim_local;
  set<int,_std::less<int>,_std::allocator<int>_> *v_local;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&start);
  __range2 = (set<int,_std::less<int>,_std::allocator<int>_> *)0x0;
  __end0 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
  i = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)this);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&i);
    if (!bVar1) break;
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end0);
    if (__range2 != (set<int,_std::less<int>,_std::allocator<int>_> *)0x0) {
      ::std::operator<<((ostream *)&start,(string *)v);
    }
    ::std::ostream::operator<<(&start,*piVar2);
    std::_Rb_tree_const_iterator<int>::operator++(&__end0);
    __range2 = (set<int,_std::less<int>,_std::allocator<int>_> *)&(__range2->_M_t)._M_impl.field_0x1
    ;
  }
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&start);
  return __return_storage_ptr__;
}

Assistant:

std::string join(const T &v, std::string delim = ",") {
    std::ostringstream s;
    size_t start = 0;
    for(const auto &i : v) {
        if(start++ > 0)
            s << delim;
        s << i;
    }
    return s.str();
}